

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O0

void __thiscall KktCheck::chDualFeas(KktCheck *this)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  int *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double rowV;
  bool istrue;
  double local_18;
  
  bVar3 = true;
  in_RDI[0x44] = 0;
  while (in_RDI[0x44] < *in_RDI) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                        (long)in_RDI[0x44]);
    if ((*pvVar4 != -1e+200) || (NAN(*pvVar4))) {
LAB_001bddd8:
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                          (long)in_RDI[0x44]);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                          (long)in_RDI[0x44]);
      if ((dVar1 == *pvVar4) && (!NAN(dVar1) && !NAN(*pvVar4))) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                            (long)in_RDI[0x44]);
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                            (long)in_RDI[0x44]);
        if (dVar1 < *pvVar4) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                              (long)in_RDI[0x44]);
          if (*pvVar4 <= 0.0 && *pvVar4 != 0.0) {
            pvVar7 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x60);
            std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)in_RDI[0x44]);
            std::abs((int)pvVar7);
            if (*(double *)(in_RDI + 0x48) <= extraout_XMM0_Qa_00 &&
                extraout_XMM0_Qa_00 != *(double *)(in_RDI + 0x48)) {
              if (in_RDI[0x58] == 1) {
                poVar5 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: l[");
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),
                                    (long)in_RDI[0x44]);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
                poVar5 = std::operator<<(poVar5,"]=");
                pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                                    (long)in_RDI[0x44]);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
                poVar5 = std::operator<<(poVar5," = x[");
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),
                                    (long)in_RDI[0x44]);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
                poVar5 = std::operator<<(poVar5,"]=");
                pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                                    (long)in_RDI[0x44]);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
                poVar5 = std::operator<<(poVar5,", z[");
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),
                                    (long)in_RDI[0x44]);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
                poVar5 = std::operator<<(poVar5,"]=");
                pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                                    (long)in_RDI[0x44]);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              }
              bVar3 = false;
            }
          }
          goto LAB_001be381;
        }
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                          (long)in_RDI[0x44]);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                          (long)in_RDI[0x44]);
      if ((dVar1 == *pvVar4) && (!NAN(dVar1) && !NAN(*pvVar4))) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                            (long)in_RDI[0x44]);
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                            (long)in_RDI[0x44]);
        if ((dVar1 < *pvVar4) &&
           (pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                                (long)in_RDI[0x44]),
           *(double *)(in_RDI + 0x48) <= *pvVar4 && *pvVar4 != *(double *)(in_RDI + 0x48))) {
          if (in_RDI[0x58] == 1) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: x[");
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),
                                (long)in_RDI[0x44]);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
            poVar5 = std::operator<<(poVar5,"]=");
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                                (long)in_RDI[0x44]);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
            poVar5 = std::operator<<(poVar5,"=u[");
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),
                                (long)in_RDI[0x44]);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
            poVar5 = std::operator<<(poVar5,"], z[");
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),
                                (long)in_RDI[0x44]);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
            poVar5 = std::operator<<(poVar5,"]=");
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                                (long)in_RDI[0x44]);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          bVar3 = false;
        }
      }
    }
    else {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),
                          (long)in_RDI[0x44]);
      if ((*pvVar4 != 1e+200) || (NAN(*pvVar4))) goto LAB_001bddd8;
      pvVar7 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x60);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)in_RDI[0x44]);
      std::abs((int)pvVar7);
      if (*(double *)(in_RDI + 0x48) <= extraout_XMM0_Qa &&
          extraout_XMM0_Qa != *(double *)(in_RDI + 0x48)) {
        if (in_RDI[0x58] == 1) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: l=-inf, x[");
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x52),
                              (long)in_RDI[0x44]);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
          poVar5 = std::operator<<(poVar5,"]=");
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),
                              (long)in_RDI[0x44]);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
          poVar5 = std::operator<<(poVar5,", u=inf, z[");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDI[0x44]);
          poVar5 = std::operator<<(poVar5,"]=");
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),
                              (long)in_RDI[0x44]);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        bVar3 = false;
      }
    }
LAB_001be381:
    in_RDI[0x44] = in_RDI[0x44] + 1;
  }
  in_RDI[0x44] = 0;
  do {
    if (in_RDI[1] <= in_RDI[0x44]) {
      if (bVar3) {
        if (in_RDI[0x58] == 1) {
          std::operator<<((ostream *)&std::cout,"Dual feasible.\n");
        }
      }
      else {
        if (in_RDI[0x58] == 1) {
          std::operator<<((ostream *)&std::cout,"KKT check error: Dual feasibility fail.\n");
        }
        *(undefined1 *)(in_RDI + 0x4a) = 1;
      }
      return;
    }
    local_18 = 0.0;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),(long)in_RDI[0x44]);
    in_RDI[0x46] = *pvVar6;
    while (iVar2 = in_RDI[0x46],
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),
                              (long)(in_RDI[0x44] + 1)), iVar2 < *pvVar6) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)in_RDI[0x46]);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5a),(long)*pvVar6);
      dVar1 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x3e),
                          (long)in_RDI[0x46]);
      local_18 = dVar1 * *pvVar4 + local_18;
      in_RDI[0x46] = in_RDI[0x46] + 1;
    }
    pvVar7 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x26);
    std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)in_RDI[0x44]);
    std::abs((int)pvVar7);
    if (*(double *)(in_RDI + 0x48) <= extraout_XMM0_Qa_01) {
LAB_001be59b:
      pvVar7 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x26);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)in_RDI[0x44]);
      std::abs((int)pvVar7);
      if ((*(double *)(in_RDI + 0x48) <= extraout_XMM0_Qa_03) ||
         (pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2c),
                              (long)in_RDI[0x44]), *pvVar4 <= local_18)) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),
                            (long)in_RDI[0x44]);
        if (*pvVar4 < local_18) {
          pvVar7 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x2c);
          std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)in_RDI[0x44]);
          std::abs((int)pvVar7);
          if (extraout_XMM0_Qa_04 < *(double *)(in_RDI + 0x48)) {
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                                (long)in_RDI[0x44]);
            if (*pvVar4 < -*(double *)(in_RDI + 0x48)) {
              if (in_RDI[0x58] == 1) {
                poVar5 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail for row ");
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4c),
                                    (long)in_RDI[0x44]);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
                poVar5 = std::operator<<(poVar5,": L= ");
                pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),
                                    (long)in_RDI[0x44]);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
                poVar5 = std::operator<<(poVar5,", Ax=");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
                poVar5 = std::operator<<(poVar5,", U=");
                pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2c),
                                    (long)in_RDI[0x44]);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
                poVar5 = std::operator<<(poVar5,", y=");
                pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                                    (long)in_RDI[0x44]);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              }
              bVar3 = false;
            }
            goto LAB_001bec3f;
          }
        }
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),
                            (long)in_RDI[0x44]);
        if ((*pvVar4 < local_18 + *(double *)(in_RDI + 0x48)) &&
           (pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2c),
                                (long)in_RDI[0x44]), local_18 < *pvVar4 + *(double *)(in_RDI + 0x48)
           )) {
          pvVar7 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x66);
          std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)in_RDI[0x44]);
          std::abs((int)pvVar7);
          if (*(double *)(in_RDI + 0x48) <= extraout_XMM0_Qa_05 &&
              extraout_XMM0_Qa_05 != *(double *)(in_RDI + 0x48)) {
            if (in_RDI[0x58] == 1) {
              poVar5 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail for row ");
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4c),
                                  (long)in_RDI[0x44]);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
              poVar5 = std::operator<<(poVar5,": L= ");
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),
                                  (long)in_RDI[0x44]);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
              poVar5 = std::operator<<(poVar5,", Ax=");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
              poVar5 = std::operator<<(poVar5,", U=");
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2c),
                                  (long)in_RDI[0x44]);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
              poVar5 = std::operator<<(poVar5,", y=");
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                                  (long)in_RDI[0x44]);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            bVar3 = false;
          }
        }
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                            (long)in_RDI[0x44]);
        if (*(double *)(in_RDI + 0x48) <= *pvVar4 && *pvVar4 != *(double *)(in_RDI + 0x48)) {
          if (in_RDI[0x58] == 1) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail for row ");
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4c),
                                (long)in_RDI[0x44]);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar6);
            poVar5 = std::operator<<(poVar5,": L= ");
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),
                                (long)in_RDI[0x44]);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
            poVar5 = std::operator<<(poVar5,", Ax=");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
            poVar5 = std::operator<<(poVar5,", U=");
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2c),
                                (long)in_RDI[0x44]);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
            poVar5 = std::operator<<(poVar5,", y=");
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                                (long)in_RDI[0x44]);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar4);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          bVar3 = false;
        }
      }
    }
    else {
      pvVar7 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x2c);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)in_RDI[0x44]);
      std::abs((int)pvVar7);
      if (*(double *)(in_RDI + 0x48) <= extraout_XMM0_Qa_02) goto LAB_001be59b;
    }
LAB_001bec3f:
    in_RDI[0x44] = in_RDI[0x44] + 1;
  } while( true );
}

Assistant:

void KktCheck::chDualFeas() {
	bool istrue = true;
	
	//check values of z_j are dual feasible
	for (i=0; i<numCol;i++) {
		// j not in L or U
		if (colLower[i] == -HSOL_CONST_INF && colUpper[i] == HSOL_CONST_INF) {
			if (abs(colDual[i]) > tol) {
				if (print == 1) 
					cout<<"Dual feasibility fail: l=-inf, x["<<cIndexRev[i]<<"]="<<colValue[i]<<", u=inf, z["<<i<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: l=-inf, x["<<i<<"]="<<colValue[i]<<", u=inf, z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
		// j in L: x=l and l<u
		else if (colValue[i] == colLower[i] && colLower[i] < colUpper[i]) {
			if (colDual[i]<0 && abs(colDual[i]) > tol) {
				if (print == 1)  
					cout<<"Dual feasibility fail: l["<<cIndexRev[i]<<"]="<<colLower[i]<<" = x["<<cIndexRev[i]<<"]="<<colValue[i]<<", z["<<cIndexRev[i]<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: l["<<i<<"]="<<colLower[i]<<" = x["<<i<<"]="<<colValue[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
		// j in U: x=u and l<u
		else if (colValue[i] == colUpper[i] && colLower[i] < colUpper[i]) {
			if (colDual[i]>tol) {
				if (print == 1)  
					cout<<"Dual feasibility fail: x["<<cIndexRev[i]<<"]="<<colValue[i]<<"=u["<<cIndexRev[i]<<"], z["<<cIndexRev[i]<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: x["<<i<<"]="<<colValue[i]<<"=u["<<i<<"], z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
	}
	
	//check values of y_i are dual feasible
	for (i=0; i<numRow;i++) {
		double rowV = 0;
		for (k=ARstart[i]; k<ARstart[i+1]; k++)
			rowV = rowV + colValue[ARindex[k]]*ARvalue[k];

		// L = Ax = U can be any sign
		if (abs(rowLower[i] - rowV) < tol && abs(rowUpper[i] - rowV) < tol) {
		}
		// L = Ax < U
		else if (abs(rowLower[i] - rowV) < tol && rowV < rowUpper[i]) {

			if (rowDual[i] > tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
				istrue = false;
			}
		}
		// L < Ax = U
		else if (rowLower[i] < rowV && abs(rowV - rowUpper[i]) < tol) {
			//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
			if (rowDual[i] < -tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
				istrue = false;
			}
		}
		// L < Ax < U
		else if ((rowLower[i] < (rowV+tol)) && (rowV < (rowUpper[i]+tol))) {
			if (abs(rowDual[i]) > tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;istrue = false;
				istrue = false;
			}
		}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Dual feasible.\n";
	}
	else  {
		if (print == 1) 
			cout<<"KKT check error: Dual feasibility fail.\n";
		istrueGlb = true;
	}
	
}